

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_icc_set_sRGB(png_const_structrp png_ptr,png_colorspacerp colorspace,png_const_bytep profile
                     ,uLong adler)

{
  uint uVar1;
  uint uVar2;
  uLong uVar3;
  uint uVar4;
  int error;
  uInt len;
  char *message;
  long lVar5;
  
  if ((~png_ptr->options & 0x30) != 0) {
    uVar1 = *(uint *)(profile + 0x54);
    len = 0;
    uVar4 = 0x10000;
    lVar5 = 0x1e;
    do {
      if (((((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ==
             *(uint *)(png_sRGB_delta + lVar5 + 0x1ee)) &&
           (uVar2 = *(uint *)(profile + 0x58),
           (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
           *(uint *)(png_sRGB_delta + lVar5 + 0x1f2))) &&
          (uVar2 = *(uint *)(profile + 0x5c),
          (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
          *(uint *)(png_sRGB_delta + lVar5 + 0x1f6))) &&
         (uVar2 = *(uint *)(profile + 0x60),
         (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
         *(uint *)(png_sRGB_delta + lVar5 + 0x1fa))) {
        if (len == 0) {
          uVar4 = *(uint *)profile;
          uVar2 = *(uint *)(profile + 0x40);
          len = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        }
        if ((len == *(uInt *)(png_sRGB_delta + lVar5 + 0x1ea)) &&
           (uVar4 == *(ushort *)((long)png_sRGB_checks[0].md5 + lVar5 + -0xc))) {
          if (adler == 0) {
            uVar3 = adler32(0,(Bytef *)0x0,0);
            adler = adler32(uVar3,profile,len);
          }
          if (adler != *(uint *)(png_sRGB_delta + lVar5 + 0x1e2)) {
LAB_0011bae4:
            png_chunk_report(png_ptr,"Not recognizing known sRGB profile that has been edited",0);
            return;
          }
          uVar3 = crc32(0,(uchar *)0x0,0);
          uVar3 = crc32(uVar3,profile,len);
          if (uVar3 != *(uint *)(png_sRGB_delta + lVar5 + 0x1e6)) goto LAB_0011bae4;
          if (png_sRGB_delta[lVar5 + 0x1ff] == '\0') {
            if (png_sRGB_delta[lVar5 + 0x1fe] != '\0') goto LAB_0011bb0b;
            message = "out-of-date sRGB profile with no signature";
            error = 0;
          }
          else {
            message = "known incorrect sRGB profile";
            error = 2;
          }
          png_chunk_report(png_ptr,message,error);
LAB_0011bb0b:
          uVar1 = *(uint *)(profile + 0x40);
          png_colorspace_set_sRGB
                    (png_ptr,colorspace,
                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    );
          return;
        }
      }
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0xfe);
  }
  return;
}

Assistant:

static int
png_compare_ICC_profile_with_sRGB(png_const_structrp png_ptr,
    png_const_bytep profile, uLong adler)
{
   /* The quick check is to verify just the MD5 signature and trust the
    * rest of the data.  Because the profile has already been verified for
    * correctness this is safe.  png_colorspace_set_sRGB will check the 'intent'
    * field too, so if the profile has been edited with an intent not defined
    * by sRGB (but maybe defined by a later ICC specification) the read of
    * the profile will fail at that point.
    */

   png_uint_32 length = 0;
   png_uint_32 intent = 0x10000; /* invalid */
#if PNG_sRGB_PROFILE_CHECKS > 1
   uLong crc = 0; /* the value for 0 length data */
#endif
   unsigned int i;

#ifdef PNG_SET_OPTION_SUPPORTED
   /* First see if PNG_SKIP_sRGB_CHECK_PROFILE has been set to "on" */
   if (((png_ptr->options >> PNG_SKIP_sRGB_CHECK_PROFILE) & 3) ==
               PNG_OPTION_ON)
      return 0;
#endif

   for (i=0; i < (sizeof png_sRGB_checks) / (sizeof png_sRGB_checks[0]); ++i)
   {
      if (png_get_uint_32(profile+84) == png_sRGB_checks[i].md5[0] &&
         png_get_uint_32(profile+88) == png_sRGB_checks[i].md5[1] &&
         png_get_uint_32(profile+92) == png_sRGB_checks[i].md5[2] &&
         png_get_uint_32(profile+96) == png_sRGB_checks[i].md5[3])
      {
         /* This may be one of the old HP profiles without an MD5, in that
          * case we can only use the length and Adler32 (note that these
          * are not used by default if there is an MD5!)
          */
#        if PNG_sRGB_PROFILE_CHECKS == 0
            if (png_sRGB_checks[i].have_md5 != 0)
               return 1+png_sRGB_checks[i].is_broken;
#        endif

         /* Profile is unsigned or more checks have been configured in. */
         if (length == 0)
         {
            length = png_get_uint_32(profile);
            intent = png_get_uint_32(profile+64);
         }

         /* Length *and* intent must match */
         if (length == (png_uint_32) png_sRGB_checks[i].length &&
            intent == (png_uint_32) png_sRGB_checks[i].intent)
         {
            /* Now calculate the adler32 if not done already. */
            if (adler == 0)
            {
               adler = adler32(0, NULL, 0);
               adler = adler32(adler, profile, length);
            }

            if (adler == png_sRGB_checks[i].adler)
            {
               /* These basic checks suggest that the data has not been
                * modified, but if the check level is more than 1 perform
                * our own crc32 checksum on the data.
                */
#              if PNG_sRGB_PROFILE_CHECKS > 1
                  if (crc == 0)
                  {
                     crc = crc32(0, NULL, 0);
                     crc = crc32(crc, profile, length);
                  }

                  /* So this check must pass for the 'return' below to happen.
                   */
                  if (crc == png_sRGB_checks[i].crc)
#              endif
               {
                  if (png_sRGB_checks[i].is_broken != 0)
                  {
                     /* These profiles are known to have bad data that may cause
                      * problems if they are used, therefore attempt to
                      * discourage their use, skip the 'have_md5' warning below,
                      * which is made irrelevant by this error.
                      */
                     png_chunk_report(png_ptr, "known incorrect sRGB profile",
                         PNG_CHUNK_ERROR);
                  }

                  /* Warn that this being done; this isn't even an error since
                   * the profile is perfectly valid, but it would be nice if
                   * people used the up-to-date ones.
                   */
                  else if (png_sRGB_checks[i].have_md5 == 0)
                  {
                     png_chunk_report(png_ptr,
                         "out-of-date sRGB profile with no signature",
                         PNG_CHUNK_WARNING);
                  }

                  return 1+png_sRGB_checks[i].is_broken;
               }
            }

# if PNG_sRGB_PROFILE_CHECKS > 0
         /* The signature matched, but the profile had been changed in some
          * way.  This probably indicates a data error or uninformed hacking.
          * Fall through to "no match".
          */
         png_chunk_report(png_ptr,
             "Not recognizing known sRGB profile that has been edited",
             PNG_CHUNK_WARNING);
         break;
# endif
         }
      }
   }

   return 0; /* no match */
}